

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

unqlite_value * unqlite_array_fetch(unqlite_value *pArray,char *zKey,int nByte)

{
  jx9_vm *pjVar1;
  sxi32 sVar2;
  jx9_hashmap_node *pNode;
  jx9_value skey;
  jx9_hashmap_node *local_68;
  jx9_value local_60;
  
  if ((pArray->iFlags & 0x40) == 0) {
    return (unqlite_value *)0x0;
  }
  if (nByte < 0) {
    nByte = SyStrlen(zKey);
  }
  jx9MemObjInit(pArray->pVm,&local_60);
  jx9MemObjStringAppend(&local_60,zKey,nByte);
  sVar2 = jx9HashmapLookup((jx9_hashmap *)(pArray->x).pOther,&local_60,&local_68);
  jx9MemObjRelease(&local_60);
  if (sVar2 == 0) {
    pjVar1 = pArray->pVm;
    if (local_68->nValIdx < (pjVar1->aMemObj).nUsed) {
      return (unqlite_value *)
             ((ulong)(local_68->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase);
    }
  }
  return (unqlite_value *)0x0;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_array_fetch(jx9_value *pArray, const char *zKey, int nByte)
{
	jx9_hashmap_node *pNode;
	jx9_value *pValue;
	jx9_value skey;
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return 0;
	}
	if( nByte < 0 ){
		nByte = (int)SyStrlen(zKey);
	}
	/* Convert the key to a jx9_value  */
	jx9MemObjInit(pArray->pVm, &skey);
	jx9MemObjStringAppend(&skey, zKey, (sxu32)nByte);
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)pArray->x.pOther, &skey, &pNode);
	jx9MemObjRelease(&skey);
	if( rc != JX9_OK ){
		/* No such entry */
		return 0;
	}
	/* Extract the target value */
	pValue = (jx9_value *)SySetAt(&pArray->pVm->aMemObj, pNode->nValIdx);
	return pValue;
}